

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O0

ai_real Assimp::ComputePositionEpsilon(aiMesh *pMesh)

{
  float *this;
  float fVar1;
  aiVector3t<float> aVar2;
  aiVector3t<float> local_48;
  aiVector3t<float> local_38;
  undefined1 local_2c [8];
  aiVector3D maxVec;
  aiVector3D minVec;
  ai_real epsilon;
  aiMesh *pMesh_local;
  
  this = &maxVec.y;
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)this);
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_2c);
  ArrayBounds<aiVector3t<float>>
            (pMesh->mVertices,pMesh->mNumVertices,(aiVector3t<float> *)this,
             (aiVector3t<float> *)local_2c);
  aVar2 = ::operator-((aiVector3t<float> *)local_2c,(aiVector3t<float> *)this);
  local_48._0_8_ = aVar2._0_8_;
  local_38.x = local_48.x;
  local_38.y = local_48.y;
  local_48.z = aVar2.z;
  local_38.z = local_48.z;
  fVar1 = aiVector3t<float>::Length(&local_38);
  return fVar1 * 0.0001;
}

Assistant:

ai_real ComputePositionEpsilon(const aiMesh* pMesh)
{
    const ai_real epsilon = ai_real( 1e-4 );

    // calculate the position bounds so we have a reliable epsilon to check position differences against
    aiVector3D minVec, maxVec;
    ArrayBounds(pMesh->mVertices,pMesh->mNumVertices,minVec,maxVec);
    return (maxVec - minVec).Length() * epsilon;
}